

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O1

void __thiscall BamTools::FilterTool::FilterTool(FilterTool *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  FilterSettings *pFVar4;
  OptionGroup *pOVar5;
  string *psVar6;
  string boolArg;
  string local_3b0;
  string local_390;
  string isDupDesc;
  string flagDesc;
  string isFailQcDesc;
  string lengthDesc;
  string insertDesc;
  string inDesc;
  string listDesc;
  string isSingletonDesc;
  string isSecondMateDesc;
  string isReverseDesc;
  string isProperPairDesc;
  string isPrimaryDesc;
  string isPairedDesc;
  string isMateReverseDesc;
  string isMateMappedDesc;
  string isMappedDesc;
  string isFirstMateDesc;
  string tagDesc;
  string queryDesc;
  string nameDesc;
  string mapQualDesc;
  string forceDesc;
  string scriptDesc;
  string regionDesc;
  string outDesc;
  string usage;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__FilterTool_001f2ee8;
  pFVar4 = (FilterSettings *)operator_new(0x318);
  FilterSettings::FilterSettings(pFVar4);
  this->m_settings = pFVar4;
  this->m_impl = (FilterToolPrivate *)0x0;
  usage._M_dataplus._M_p = (pointer)&usage.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&usage,
             "[-in <filename> -in <filename> ... | -list <filelist>] [-out <filename> | [-forceCompression]] [-region <REGION>] [ [-script <filename] | [filterOptions] ]"
             ,"");
  paVar1 = &inDesc.field_2;
  inDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&inDesc,"bamtools filter","");
  paVar2 = &listDesc.field_2;
  listDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&listDesc,"filters BAM file(s)","");
  Options::SetProgramInfo(&inDesc,&listDesc,&usage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)listDesc._M_dataplus._M_p != paVar2) {
    operator_delete(listDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inDesc._M_dataplus._M_p != paVar1) {
    operator_delete(inDesc._M_dataplus._M_p);
  }
  inDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&inDesc,"Input & Output","");
  pOVar5 = Options::CreateOptionGroup(&inDesc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inDesc._M_dataplus._M_p != paVar1) {
    operator_delete(inDesc._M_dataplus._M_p);
  }
  inDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&inDesc,"the input BAM file(s)","");
  listDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&listDesc,"the input BAM file list, one line per file","");
  outDesc._M_dataplus._M_p = (pointer)&outDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&outDesc,"the output BAM file","");
  regionDesc._M_dataplus._M_p = (pointer)&regionDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&regionDesc,
             "only read data from this genomic region (see documentation for more details)","");
  scriptDesc._M_dataplus._M_p = (pointer)&scriptDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&scriptDesc,"the filter script file (see documentation for more details)","")
  ;
  forceDesc._M_dataplus._M_p = (pointer)&forceDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&forceDesc,
             "if results are sent to stdout (like when piping to another tool), default behavior is to leave output uncompressed. Use this flag to override and force compression"
             ,"");
  paVar1 = &flagDesc.field_2;
  flagDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flagDesc,"-in","");
  paVar2 = &insertDesc.field_2;
  insertDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&insertDesc,"BAM filename","");
  paVar3 = &lengthDesc.field_2;
  lengthDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lengthDesc,"");
  pFVar4 = this->m_settings;
  psVar6 = Options::StandardIn_abi_cxx11_();
  Options::
  AddValueOption<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string_const>
            (&flagDesc,&insertDesc,&inDesc,&lengthDesc,&pFVar4->HasInput,&pFVar4->InputFiles,pOVar5,
             psVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lengthDesc._M_dataplus._M_p != paVar3) {
    operator_delete(lengthDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)insertDesc._M_dataplus._M_p != paVar2) {
    operator_delete(insertDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagDesc._M_dataplus._M_p != paVar1) {
    operator_delete(flagDesc._M_dataplus._M_p);
  }
  flagDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flagDesc,"-list","");
  insertDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&insertDesc,"filename","");
  lengthDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lengthDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&flagDesc,&insertDesc,&listDesc,&lengthDesc,&this->m_settings->HasInputFilelist,
             &this->m_settings->InputFilelist,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lengthDesc._M_dataplus._M_p != paVar3) {
    operator_delete(lengthDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)insertDesc._M_dataplus._M_p != paVar2) {
    operator_delete(insertDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagDesc._M_dataplus._M_p != paVar1) {
    operator_delete(flagDesc._M_dataplus._M_p);
  }
  flagDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flagDesc,"-out","");
  insertDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&insertDesc,"BAM filename","");
  lengthDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lengthDesc,"");
  pFVar4 = this->m_settings;
  psVar6 = Options::StandardOut_abi_cxx11_();
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&flagDesc,&insertDesc,&outDesc,&lengthDesc,&pFVar4->HasOutput,&pFVar4->OutputFilename,
             pOVar5,psVar6);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lengthDesc._M_dataplus._M_p != paVar3) {
    operator_delete(lengthDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)insertDesc._M_dataplus._M_p != paVar2) {
    operator_delete(insertDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagDesc._M_dataplus._M_p != paVar1) {
    operator_delete(flagDesc._M_dataplus._M_p);
  }
  flagDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flagDesc,"-region","");
  insertDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&insertDesc,"REGION","");
  lengthDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lengthDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&flagDesc,&insertDesc,&regionDesc,&lengthDesc,&this->m_settings->HasRegion,
             &this->m_settings->Region,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lengthDesc._M_dataplus._M_p != paVar3) {
    operator_delete(lengthDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)insertDesc._M_dataplus._M_p != paVar2) {
    operator_delete(insertDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagDesc._M_dataplus._M_p != paVar1) {
    operator_delete(flagDesc._M_dataplus._M_p);
  }
  flagDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flagDesc,"-script","");
  insertDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&insertDesc,"filename","");
  lengthDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&lengthDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&flagDesc,&insertDesc,&scriptDesc,&lengthDesc,&this->m_settings->HasScript,
             &this->m_settings->ScriptFilename,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lengthDesc._M_dataplus._M_p != paVar3) {
    operator_delete(lengthDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)insertDesc._M_dataplus._M_p != paVar2) {
    operator_delete(insertDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagDesc._M_dataplus._M_p != paVar1) {
    operator_delete(flagDesc._M_dataplus._M_p);
  }
  flagDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flagDesc,"-forceCompression","");
  Options::AddOption(&flagDesc,&forceDesc,&this->m_settings->IsForceCompression,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagDesc._M_dataplus._M_p != paVar1) {
    operator_delete(flagDesc._M_dataplus._M_p);
  }
  flagDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&flagDesc,"General Filters","");
  pOVar5 = Options::CreateOptionGroup(&flagDesc);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagDesc._M_dataplus._M_p != paVar1) {
    operator_delete(flagDesc._M_dataplus._M_p);
  }
  flagDesc._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&flagDesc,
             "keep reads with this *exact* alignment flag (for more detailed queries, see below)",""
            );
  insertDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&insertDesc,"keep reads with insert size that matches pattern","");
  lengthDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&lengthDesc,"keep reads with length that matches pattern","");
  mapQualDesc._M_dataplus._M_p = (pointer)&mapQualDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&mapQualDesc,"keep reads with map quality that matches pattern","");
  nameDesc._M_dataplus._M_p = (pointer)&nameDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&nameDesc,"keep reads with name that matches pattern","");
  queryDesc._M_dataplus._M_p = (pointer)&queryDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&queryDesc,"keep reads with motif that matches pattern","");
  tagDesc._M_dataplus._M_p = (pointer)&tagDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&tagDesc,"keep reads with this key=>value pair","");
  paVar1 = &boolArg.field_2;
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"-alignmentFlag","");
  paVar2 = &isDupDesc.field_2;
  isDupDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isDupDesc,"int","");
  paVar3 = &isFailQcDesc.field_2;
  isFailQcDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isFailQcDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&flagDesc,&isFailQcDesc,&this->m_settings->HasAlignmentFlagFilter,
             &this->m_settings->AlignmentFlagFilter,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFailQcDesc._M_dataplus._M_p != paVar3) {
    operator_delete(isFailQcDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isDupDesc._M_dataplus._M_p != paVar2) {
    operator_delete(isDupDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != paVar1) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"-insertSize","");
  isDupDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isDupDesc,"int","");
  isFailQcDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isFailQcDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&insertDesc,&isFailQcDesc,&this->m_settings->HasInsertSizeFilter,
             &this->m_settings->InsertSizeFilter,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFailQcDesc._M_dataplus._M_p != paVar3) {
    operator_delete(isFailQcDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isDupDesc._M_dataplus._M_p != paVar2) {
    operator_delete(isDupDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != paVar1) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"-length","");
  isDupDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isDupDesc,"int","");
  isFailQcDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isFailQcDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&lengthDesc,&isFailQcDesc,&this->m_settings->HasLengthFilter,
             &this->m_settings->LengthFilter,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFailQcDesc._M_dataplus._M_p != paVar3) {
    operator_delete(isFailQcDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isDupDesc._M_dataplus._M_p != paVar2) {
    operator_delete(isDupDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != paVar1) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"-mapQuality","");
  isDupDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isDupDesc,"[0-255]","");
  isFailQcDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isFailQcDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&mapQualDesc,&isFailQcDesc,&this->m_settings->HasMapQualityFilter,
             &this->m_settings->MapQualityFilter,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFailQcDesc._M_dataplus._M_p != paVar3) {
    operator_delete(isFailQcDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isDupDesc._M_dataplus._M_p != paVar2) {
    operator_delete(isDupDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != paVar1) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"-name","");
  isDupDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isDupDesc,"string","");
  isFailQcDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isFailQcDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&nameDesc,&isFailQcDesc,&this->m_settings->HasNameFilter,
             &this->m_settings->NameFilter,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFailQcDesc._M_dataplus._M_p != paVar3) {
    operator_delete(isFailQcDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isDupDesc._M_dataplus._M_p != paVar2) {
    operator_delete(isDupDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != paVar1) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"-queryBases","");
  isDupDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isDupDesc,"string","");
  isFailQcDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isFailQcDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&queryDesc,&isFailQcDesc,&this->m_settings->HasQueryBasesFilter,
             &this->m_settings->QueryBasesFilter,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFailQcDesc._M_dataplus._M_p != paVar3) {
    operator_delete(isFailQcDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isDupDesc._M_dataplus._M_p != paVar2) {
    operator_delete(isDupDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != paVar1) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"-tag","");
  isDupDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isDupDesc,"TAG:VALUE","");
  isFailQcDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&isFailQcDesc,"");
  Options::AddValueOption<std::__cxx11::string>
            (&boolArg,&isDupDesc,&tagDesc,&isFailQcDesc,&this->m_settings->HasTagFilter,
             &this->m_settings->TagFilter,pOVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFailQcDesc._M_dataplus._M_p != paVar3) {
    operator_delete(isFailQcDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isDupDesc._M_dataplus._M_p != paVar2) {
    operator_delete(isDupDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != paVar1) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"Alignment Flag Filters","");
  pOVar5 = Options::CreateOptionGroup(&boolArg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != paVar1) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  boolArg._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&boolArg,"true/false","");
  isDupDesc._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isDupDesc,"keep only alignments that are marked as duplicate?","");
  isFailQcDesc._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isFailQcDesc,"keep only alignments that failed QC?","");
  isFirstMateDesc._M_dataplus._M_p = (pointer)&isFirstMateDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isFirstMateDesc,"keep only alignments marked as first mate?","");
  isMappedDesc._M_dataplus._M_p = (pointer)&isMappedDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isMappedDesc,"keep only alignments that were mapped?","");
  isMateMappedDesc._M_dataplus._M_p = (pointer)&isMateMappedDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isMateMappedDesc,"keep only alignments with mates that mapped","");
  isMateReverseDesc._M_dataplus._M_p = (pointer)&isMateReverseDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isMateReverseDesc,"keep only alignments with mate on reverese strand?","");
  isPairedDesc._M_dataplus._M_p = (pointer)&isPairedDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isPairedDesc,"keep only alignments that were sequenced as paired?","");
  isPrimaryDesc._M_dataplus._M_p = (pointer)&isPrimaryDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isPrimaryDesc,"keep only alignments marked as primary?","");
  isProperPairDesc._M_dataplus._M_p = (pointer)&isProperPairDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isProperPairDesc,"keep only alignments that passed PE resolution?","");
  isReverseDesc._M_dataplus._M_p = (pointer)&isReverseDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isReverseDesc,"keep only alignments on reverse strand?","");
  isSecondMateDesc._M_dataplus._M_p = (pointer)&isSecondMateDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isSecondMateDesc,"keep only alignments marked as second mate?","");
  isSingletonDesc._M_dataplus._M_p = (pointer)&isSingletonDesc.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&isSingletonDesc,"keep only singletons","");
  paVar1 = &local_390.field_2;
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isDuplicate","");
  paVar2 = &local_3b0.field_2;
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isDupDesc,&local_3b0,&this->m_settings->HasIsDuplicateFilter,
             &this->m_settings->IsDuplicateFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isFailedQC","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isFailQcDesc,&local_3b0,&this->m_settings->HasIsFailedQCFilter,
             &this->m_settings->IsFailedQCFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isFirstMate","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isFirstMateDesc,&local_3b0,&this->m_settings->HasIsFirstMateFilter
             ,&this->m_settings->IsFirstMateFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isMapped","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isMappedDesc,&local_3b0,&this->m_settings->HasIsMappedFilter,
             &this->m_settings->IsMappedFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isMateMapped","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isMateMappedDesc,&local_3b0,
             &this->m_settings->HasIsMateMappedFilter,&this->m_settings->IsMateMappedFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isMateReverseStrand","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isMateReverseDesc,&local_3b0,
             &this->m_settings->HasIsMateReverseStrandFilter,
             &this->m_settings->IsMateReverseStrandFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isPaired","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isPairedDesc,&local_3b0,&this->m_settings->HasIsPairedFilter,
             &this->m_settings->IsPairedFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isPrimaryAlignment","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isPrimaryDesc,&local_3b0,
             &this->m_settings->HasIsPrimaryAlignmentFilter,
             &this->m_settings->IsPrimaryAlignmentFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isProperPair","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isProperPairDesc,&local_3b0,
             &this->m_settings->HasIsProperPairFilter,&this->m_settings->IsProperPairFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isReverseStrand","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isReverseDesc,&local_3b0,
             &this->m_settings->HasIsReverseStrandFilter,&this->m_settings->IsReverseStrandFilter,
             pOVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isSecondMate","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isSecondMateDesc,&local_3b0,
             &this->m_settings->HasIsSecondMateFilter,&this->m_settings->IsSecondMateFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  local_390._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"-isSingleton","");
  local_3b0._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"");
  Options::AddValueOption<std::__cxx11::string,std::__cxx11::string_const>
            (&local_390,&boolArg,&isSingletonDesc,&local_3b0,&this->m_settings->HasIsSingletonFilter
             ,&this->m_settings->IsSingletonFilter,pOVar5,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &TRUE_STR_abi_cxx11_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0._M_dataplus._M_p != paVar2) {
    operator_delete(local_3b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != paVar1) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isSingletonDesc._M_dataplus._M_p != &isSingletonDesc.field_2) {
    operator_delete(isSingletonDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isSecondMateDesc._M_dataplus._M_p != &isSecondMateDesc.field_2) {
    operator_delete(isSecondMateDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isReverseDesc._M_dataplus._M_p != &isReverseDesc.field_2) {
    operator_delete(isReverseDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isProperPairDesc._M_dataplus._M_p != &isProperPairDesc.field_2) {
    operator_delete(isProperPairDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isPrimaryDesc._M_dataplus._M_p != &isPrimaryDesc.field_2) {
    operator_delete(isPrimaryDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isPairedDesc._M_dataplus._M_p != &isPairedDesc.field_2) {
    operator_delete(isPairedDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isMateReverseDesc._M_dataplus._M_p != &isMateReverseDesc.field_2) {
    operator_delete(isMateReverseDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isMateMappedDesc._M_dataplus._M_p != &isMateMappedDesc.field_2) {
    operator_delete(isMateMappedDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isMappedDesc._M_dataplus._M_p != &isMappedDesc.field_2) {
    operator_delete(isMappedDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFirstMateDesc._M_dataplus._M_p != &isFirstMateDesc.field_2) {
    operator_delete(isFirstMateDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isFailQcDesc._M_dataplus._M_p != paVar3) {
    operator_delete(isFailQcDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)isDupDesc._M_dataplus._M_p != &isDupDesc.field_2) {
    operator_delete(isDupDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)boolArg._M_dataplus._M_p != &boolArg.field_2) {
    operator_delete(boolArg._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tagDesc._M_dataplus._M_p != &tagDesc.field_2) {
    operator_delete(tagDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)queryDesc._M_dataplus._M_p != &queryDesc.field_2) {
    operator_delete(queryDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)nameDesc._M_dataplus._M_p != &nameDesc.field_2) {
    operator_delete(nameDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)mapQualDesc._M_dataplus._M_p != &mapQualDesc.field_2) {
    operator_delete(mapQualDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)lengthDesc._M_dataplus._M_p != &lengthDesc.field_2) {
    operator_delete(lengthDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)insertDesc._M_dataplus._M_p != &insertDesc.field_2) {
    operator_delete(insertDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)flagDesc._M_dataplus._M_p != &flagDesc.field_2) {
    operator_delete(flagDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)forceDesc._M_dataplus._M_p != &forceDesc.field_2) {
    operator_delete(forceDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)scriptDesc._M_dataplus._M_p != &scriptDesc.field_2) {
    operator_delete(scriptDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)regionDesc._M_dataplus._M_p != &regionDesc.field_2) {
    operator_delete(regionDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)outDesc._M_dataplus._M_p != &outDesc.field_2) {
    operator_delete(outDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)listDesc._M_dataplus._M_p != &listDesc.field_2) {
    operator_delete(listDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)inDesc._M_dataplus._M_p != &inDesc.field_2) {
    operator_delete(inDesc._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)usage._M_dataplus._M_p != &usage.field_2) {
    operator_delete(usage._M_dataplus._M_p);
  }
  return;
}

Assistant:

FilterTool::FilterTool()
    : AbstractTool()
    , m_settings(new FilterSettings)
    , m_impl(0)
{
    // ----------------------------------
    // set program details

    const std::string usage =
        "[-in <filename> -in <filename> ... | -list <filelist>] "
        "[-out <filename> | [-forceCompression]] [-region <REGION>] "
        "[ [-script <filename] | [filterOptions] ]";

    Options::SetProgramInfo("bamtools filter", "filters BAM file(s)", usage);

    // ----------------------------------
    // I/O options

    OptionGroup* IO_Opts = Options::CreateOptionGroup("Input & Output");

    const std::string inDesc = "the input BAM file(s)";
    const std::string listDesc = "the input BAM file list, one line per file";
    const std::string outDesc = "the output BAM file";
    const std::string regionDesc =
        "only read data from this genomic region (see documentation for more details)";
    const std::string scriptDesc = "the filter script file (see documentation for more details)";
    const std::string forceDesc =
        "if results are sent to stdout (like when piping to another tool), "
        "default behavior is to leave output uncompressed. Use this flag to "
        "override and force compression";

    Options::AddValueOption("-in", "BAM filename", inDesc, "", m_settings->HasInput,
                            m_settings->InputFiles, IO_Opts, Options::StandardIn());
    Options::AddValueOption("-list", "filename", listDesc, "", m_settings->HasInputFilelist,
                            m_settings->InputFilelist, IO_Opts);
    Options::AddValueOption("-out", "BAM filename", outDesc, "", m_settings->HasOutput,
                            m_settings->OutputFilename, IO_Opts, Options::StandardOut());
    Options::AddValueOption("-region", "REGION", regionDesc, "", m_settings->HasRegion,
                            m_settings->Region, IO_Opts);
    Options::AddValueOption("-script", "filename", scriptDesc, "", m_settings->HasScript,
                            m_settings->ScriptFilename, IO_Opts);
    Options::AddOption("-forceCompression", forceDesc, m_settings->IsForceCompression, IO_Opts);

    // ----------------------------------
    // general filter options

    OptionGroup* FilterOpts = Options::CreateOptionGroup("General Filters");

    const std::string flagDesc =
        "keep reads with this *exact* alignment flag (for more detailed queries, see below)";
    const std::string insertDesc = "keep reads with insert size that matches pattern";
    const std::string lengthDesc = "keep reads with length that matches pattern";
    const std::string mapQualDesc = "keep reads with map quality that matches pattern";
    const std::string nameDesc = "keep reads with name that matches pattern";
    const std::string queryDesc = "keep reads with motif that matches pattern";
    const std::string tagDesc = "keep reads with this key=>value pair";

    Options::AddValueOption("-alignmentFlag", "int", flagDesc, "",
                            m_settings->HasAlignmentFlagFilter, m_settings->AlignmentFlagFilter,
                            FilterOpts);
    Options::AddValueOption("-insertSize", "int", insertDesc, "", m_settings->HasInsertSizeFilter,
                            m_settings->InsertSizeFilter, FilterOpts);
    Options::AddValueOption("-length", "int", lengthDesc, "", m_settings->HasLengthFilter,
                            m_settings->LengthFilter, FilterOpts);
    Options::AddValueOption("-mapQuality", "[0-255]", mapQualDesc, "",
                            m_settings->HasMapQualityFilter, m_settings->MapQualityFilter,
                            FilterOpts);
    Options::AddValueOption("-name", "string", nameDesc, "", m_settings->HasNameFilter,
                            m_settings->NameFilter, FilterOpts);
    Options::AddValueOption("-queryBases", "string", queryDesc, "", m_settings->HasQueryBasesFilter,
                            m_settings->QueryBasesFilter, FilterOpts);
    Options::AddValueOption("-tag", "TAG:VALUE", tagDesc, "", m_settings->HasTagFilter,
                            m_settings->TagFilter, FilterOpts);

    // ----------------------------------
    // alignment flag filter options

    OptionGroup* AlignmentFlagOpts = Options::CreateOptionGroup("Alignment Flag Filters");

    const std::string boolArg = "true/false";
    const std::string isDupDesc = "keep only alignments that are marked as duplicate?";
    const std::string isFailQcDesc = "keep only alignments that failed QC?";
    const std::string isFirstMateDesc = "keep only alignments marked as first mate?";
    const std::string isMappedDesc = "keep only alignments that were mapped?";
    const std::string isMateMappedDesc = "keep only alignments with mates that mapped";
    const std::string isMateReverseDesc = "keep only alignments with mate on reverese strand?";
    const std::string isPairedDesc = "keep only alignments that were sequenced as paired?";
    const std::string isPrimaryDesc = "keep only alignments marked as primary?";
    const std::string isProperPairDesc = "keep only alignments that passed PE resolution?";
    const std::string isReverseDesc = "keep only alignments on reverse strand?";
    const std::string isSecondMateDesc = "keep only alignments marked as second mate?";
    const std::string isSingletonDesc = "keep only singletons";

    Options::AddValueOption("-isDuplicate", boolArg, isDupDesc, "",
                            m_settings->HasIsDuplicateFilter, m_settings->IsDuplicateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isFailedQC", boolArg, isFailQcDesc, "",
                            m_settings->HasIsFailedQCFilter, m_settings->IsFailedQCFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isFirstMate", boolArg, isFirstMateDesc, "",
                            m_settings->HasIsFirstMateFilter, m_settings->IsFirstMateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMapped", boolArg, isMappedDesc, "", m_settings->HasIsMappedFilter,
                            m_settings->IsMappedFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMateMapped", boolArg, isMateMappedDesc, "",
                            m_settings->HasIsMateMappedFilter, m_settings->IsMateMappedFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isMateReverseStrand", boolArg, isMateReverseDesc, "",
                            m_settings->HasIsMateReverseStrandFilter,
                            m_settings->IsMateReverseStrandFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isPaired", boolArg, isPairedDesc, "", m_settings->HasIsPairedFilter,
                            m_settings->IsPairedFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isPrimaryAlignment", boolArg, isPrimaryDesc, "",
                            m_settings->HasIsPrimaryAlignmentFilter,
                            m_settings->IsPrimaryAlignmentFilter, AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isProperPair", boolArg, isProperPairDesc, "",
                            m_settings->HasIsProperPairFilter, m_settings->IsProperPairFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isReverseStrand", boolArg, isReverseDesc, "",
                            m_settings->HasIsReverseStrandFilter, m_settings->IsReverseStrandFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isSecondMate", boolArg, isSecondMateDesc, "",
                            m_settings->HasIsSecondMateFilter, m_settings->IsSecondMateFilter,
                            AlignmentFlagOpts, TRUE_STR);
    Options::AddValueOption("-isSingleton", boolArg, isSingletonDesc, "",
                            m_settings->HasIsSingletonFilter, m_settings->IsSingletonFilter,
                            AlignmentFlagOpts, TRUE_STR);
}